

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.cpp
# Opt level: O2

void __thiscall
Hpipe::Instruction::get_unused_rec
          (Instruction *this,Vec<Hpipe::Instruction_*> *to_remove,Instruction **init)

{
  pointer pTVar1;
  int iVar2;
  Transition *t;
  pointer pTVar3;
  Instruction *local_28;
  
  local_28 = (Instruction *)(ulong)cur_op_id;
  if (this->op_id == cur_op_id) {
    return;
  }
  this->op_id = cur_op_id;
  iVar2 = (*this->_vptr_Instruction[0xb])();
  if ((char)iVar2 != '\0') {
    if (*init == this) {
      pTVar3 = (this->next).super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
               super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((long)(this->next).super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pTVar3 != 0x28) goto LAB_001576cd;
      *init = pTVar3->inst;
    }
    local_28 = this;
    std::vector<Hpipe::Instruction*,std::allocator<Hpipe::Instruction*>>::
    emplace_back<Hpipe::Instruction*const&>
              ((vector<Hpipe::Instruction*,std::allocator<Hpipe::Instruction*>> *)to_remove,
               &local_28);
  }
LAB_001576cd:
  pTVar1 = (this->next).super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
           super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pTVar3 = (this->next).super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
                super__Vector_impl_data._M_start; pTVar3 != pTVar1; pTVar3 = pTVar3 + 1) {
    (*pTVar3->inst->_vptr_Instruction[8])(pTVar3->inst,to_remove,init);
  }
  return;
}

Assistant:

void Instruction::get_unused_rec( Vec<Instruction *> &to_remove, Instruction *&init ) {
    if ( op_id == Instruction::cur_op_id )
        return;
    op_id = Instruction::cur_op_id;

    if ( can_be_deleted() ) {
        if ( this == init ) {
            if ( next.size() == 1 ) {
                init = next[ 0 ].inst;
                to_remove << this;
            }
        } else
            to_remove << this;
    }

    for( Transition &t : next )
        t.inst->get_unused_rec( to_remove, init );
}